

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_maps.hpp
# Opt level: O3

void PatchOptimizeMaps::remove_useless_map_variants(World *world)

{
  mapped_type pMVar1;
  mapped_type *ppMVar2;
  _Rb_tree_node_base *p_Var3;
  pointer puVar4;
  initializer_list<unsigned_short> __l;
  vector<unsigned_short,_std::allocator<unsigned_short>_> MAPS_TO_REMOVE_VARIANTS_FROM;
  allocator_type local_59;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_58;
  undefined8 local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  local_40 = 0x37003b003300e0;
  local_38 = 0x294004e;
  local_34 = 0x5e;
  __l._M_len = 7;
  __l._M_array = (iterator)&local_40;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_58,__l,&local_59);
  local_40 = CONCAT62(local_40._2_6_,0x294);
  ppMVar2 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(&world->_maps,(key_type *)&local_40);
  (*ppMVar2)->_map_setup_addr = 0xffffffff;
  for (puVar4 = local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_start;
      puVar4 != local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
    local_40._2_6_ = (undefined6)((ulong)local_40 >> 0x10);
    local_40 = CONCAT62(local_40._2_6_,*puVar4);
    ppMVar2 = std::
              map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
              ::at(&world->_maps,(key_type *)&local_40);
    pMVar1 = *ppMVar2;
    for (p_Var3 = (pMVar1->_variants)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(pMVar1->_variants)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      Map::clear(*(Map **)(p_Var3 + 1));
    }
    std::
    _Rb_tree<Map_*,_std::pair<Map_*const,_Flag>,_std::_Select1st<std::pair<Map_*const,_Flag>_>,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>
    ::clear(&(pMVar1->_variants)._M_t);
  }
  if (local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void remove_useless_map_variants(World& world)
    {
        // Clear unreachable variants and prevent them from triggering
        const std::vector<uint16_t> MAPS_TO_REMOVE_VARIANTS_FROM = {
                MAP_THIEVES_HIDEOUT_TREASURE_ROOM,
                MAP_MERCATOR_CASTLE_THRONE_ROOM,
                MAP_MERCATOR_CASTLE_MAIN_HALL,
                MAP_MERCATOR_CASTLE_ENTRANCE_HALLWAY,
                MAP_MERCATOR_CASTLE_ARMORY_0F,
                MAP_MERCATOR_DOCKS_SUPPLY_SHOP,
                MAP_MERCATOR_CASTLE_2F_HALLWAY
        };

        world.map(MAP_MERCATOR_DOCKS_SUPPLY_SHOP)->map_setup_addr(0xFFFFFFFF);

        for(uint16_t map_id : MAPS_TO_REMOVE_VARIANTS_FROM)
        {
            Map* map = world.map(map_id);
            for(auto& [variant_map, flag] : map->variants())
                variant_map->clear();
            map->variants().clear();
        }
    }